

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_hdr.c
# Opt level: O0

void jpege_bits_setup(JpegeBits ctx,RK_U8 *buf,RK_S32 size)

{
  JpegeBitsImpl *impl;
  RK_S32 size_local;
  RK_U8 *buf_local;
  JpegeBits ctx_local;
  
  *(RK_U8 **)ctx = buf;
  *(RK_U8 **)((long)ctx + 8) = buf;
  *(RK_S32 *)((long)ctx + 0x10) = size;
  *(undefined4 *)((long)ctx + 0x14) = 0;
  *(undefined4 *)((long)ctx + 0x18) = 0;
  *(undefined4 *)((long)ctx + 0x1c) = 0;
  *(undefined4 *)((long)ctx + 0x20) = 0;
  return;
}

Assistant:

void jpege_bits_setup(JpegeBits ctx, RK_U8 *buf, RK_S32 size)
{
    JpegeBitsImpl *impl = (JpegeBitsImpl *)ctx;

    impl->buffer = buf;
    impl->stream = buf;
    impl->size = size;
    impl->byteCnt = 0;
    impl->bitCnt = 0;
    impl->byteBuffer = 0;
    impl->bufferedBits = 0;
}